

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.cpp
# Opt level: O3

quint32 __thiscall
HPack::HuffmanDecoder::addTable(HuffmanDecoder *this,quint32 prefix,quint32 index)

{
  pointer *ppPVar1;
  iterator __position;
  long in_FS_OFFSET;
  PrefixTable local_2c;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_2c.offset =
       (int)((ulong)((long)(this->tableData).
                           super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->tableData).
                          super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  __position._M_current =
       (this->prefixTables).
       super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_2c.prefixLength = prefix;
  local_2c.indexLength = index;
  if (__position._M_current ==
      (this->prefixTables).
      super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<HPack::PrefixTable,std::allocator<HPack::PrefixTable>>::
    _M_realloc_insert<HPack::PrefixTable_const&>
              ((vector<HPack::PrefixTable,std::allocator<HPack::PrefixTable>> *)this,__position,
               &local_2c);
  }
  else {
    (__position._M_current)->offset = local_2c.offset;
    (__position._M_current)->prefixLength = prefix;
    (__position._M_current)->indexLength = index;
    ppPVar1 = &(this->prefixTables).
               super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppPVar1 = *ppPVar1 + 1;
  }
  std::vector<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>::resize
            (&this->tableData,
             (ulong)(uint)(1 << ((byte)local_2c.indexLength & 0x1f)) +
             ((long)(this->tableData).
                    super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->tableData).
                    super__Vector_base<HPack::PrefixTableEntry,_std::allocator<HPack::PrefixTableEntry>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (int)((ulong)((long)(this->prefixTables).
                               super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->prefixTables).
                              super__Vector_base<HPack::PrefixTable,_std::allocator<HPack::PrefixTable>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 - 1;
  }
  __stack_chk_fail();
}

Assistant:

quint32 HuffmanDecoder::addTable(quint32 prefix, quint32 index)
{
    PrefixTable newTable{prefix, index};
    newTable.offset = quint32(tableData.size());
    prefixTables.push_back(newTable);
    // Add entries for this table:
    tableData.resize(tableData.size() + newTable.size());

    return quint32(prefixTables.size() - 1);
}